

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O3

void __thiscall mjs::interpreter::impl::put_value(impl *this,value *v,value *w)

{
  uint *puVar1;
  long *plVar2;
  native_error_exception *this_00;
  wstring_view p;
  object_ptr b;
  wstring local_1f8;
  wstring_view local_1d8;
  wchar_t *local_1c8;
  size_t local_1c0;
  wstring_view local_1a8;
  gc_heap_ptr_untyped local_198 [23];
  
  if (v->type_ == reference) {
    local_198[0].heap_ =
         (v->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
    local_198[0].pos_ = *(uint32_t *)((long)&v->field_1 + 8);
    if (local_198[0].heap_ != (gc_heap *)0x0) {
      gc_heap::attach(local_198[0].heap_,local_198);
    }
    if (this->strict_mode_ == true) {
      puVar1 = (uint *)gc_heap_ptr_untyped::get
                                 ((gc_heap_ptr_untyped *)&(v->field_1).r_.property_name_);
      p._M_str = (wchar_t *)(puVar1 + 1);
      p._M_len = (ulong)*puVar1;
      check_strict_mode_put(this,(object_ptr *)local_198,p);
    }
    if (local_198[0].heap_ == (gc_heap *)0x0) {
      local_1f8._M_dataplus._M_p = (pointer)(this->global_).super_gc_heap_ptr_untyped.heap_;
      local_1f8._M_string_length._0_4_ = (this->global_).super_gc_heap_ptr_untyped.pos_;
      if ((gc_heap *)local_1f8._M_dataplus._M_p != (gc_heap *)0x0) {
        gc_heap::attach((gc_heap *)local_1f8._M_dataplus._M_p,(gc_heap_ptr_untyped *)&local_1f8);
      }
      gc_heap_ptr_untyped::operator=(local_198,(gc_heap_ptr_untyped *)&local_1f8);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_1f8);
    }
    plVar2 = (long *)gc_heap_ptr_untyped::get(local_198);
    (**(code **)(*plVar2 + 8))(plVar2,(undefined1 *)((long)&v->field_1 + 0x10),w,0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped(local_198);
    return;
  }
  std::__cxx11::wostringstream::wostringstream((wostringstream *)local_198);
  debug_print((wostream *)local_198,v,4,0x7fffffff,0);
  std::operator<<((wostream *)local_198," is not a reference");
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  stack_trace_abi_cxx11_(&local_1f8,this);
  local_1d8._M_str = local_1f8._M_dataplus._M_p;
  std::__cxx11::wstringbuf::str();
  local_1a8._M_len = local_1c0;
  local_1a8._M_str = local_1c8;
  native_error_exception::native_error_exception(this_00,reference,&local_1d8,&local_1a8);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

void put_value(const value& v, const value& w) const {
        if (v.type() != value_type::reference) {
            std::wostringstream woss;
            debug_print(woss, v, 4);
            woss << " is not a reference";
            throw native_error_exception{native_error_type::reference, stack_trace(), woss.str()};
        }
        auto& r = v.reference_value();
        auto b = r.base();
        if (strict_mode_) {
            check_strict_mode_put(b, r.property_name().view());
        }
        if (!b) {
            b = global_;
        }
        b->put(r.property_name(), w);
    }